

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processConfig.cpp
# Opt level: O0

void __thiscall CommandWrite::CommandWrite(CommandWrite *this,string *stream,string *group)

{
  string *in_RDX;
  string *in_RSI;
  Command *in_RDI;
  
  Command::Command(in_RDI,(Operation)((ulong)in_RDX >> 0x20));
  in_RDI->_vptr_Command = (_func_int **)&PTR__CommandWrite_001568a0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::string((string *)in_RDI[1].conditionalStream.field_2._M_local_buf,in_RDX);
  std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>::
  vector((vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_> *)
         0x1182b6);
  return;
}

Assistant:

CommandWrite::CommandWrite(std::string stream, std::string group)
: Command(Operation::Write), streamName(stream), groupName(group)
{
}